

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderFrame(ImVec2 p_min,ImVec2 p_max,ImU32 fill_col,bool border,float rounding)

{
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  ImU32 IVar3;
  undefined7 in_register_00000031;
  ImVec2 p_min_local;
  ImVec2 p_max_local;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  p_min_local = p_min;
  p_max_local = p_max;
  ImDrawList::AddRectFilled(pIVar1->DrawList,&p_min_local,&p_max_local,fill_col,rounding,0xf);
  if (((int)CONCAT71(in_register_00000031,border) != 0) && ((pIVar1->Flags & 0x80) != 0)) {
    pIVar2 = pIVar1->DrawList;
    local_38.x = p_min_local.x + 1.0;
    local_38.y = p_min_local.y + 1.0;
    local_40.x = p_max_local.x + 1.0;
    local_40.y = p_max_local.y + 1.0;
    IVar3 = GetColorU32(6,1.0);
    ImDrawList::AddRect(pIVar2,&local_38,&local_40,IVar3,rounding,0xf,1.0);
    pIVar2 = pIVar1->DrawList;
    IVar3 = GetColorU32(5,1.0);
    ImDrawList::AddRect(pIVar2,&p_min_local,&p_max_local,IVar3,rounding,0xf,1.0);
  }
  return;
}

Assistant:

void ImGui::RenderFrame(ImVec2 p_min, ImVec2 p_max, ImU32 fill_col, bool border, float rounding)
{
    ImGuiWindow* window = GetCurrentWindow();

    window->DrawList->AddRectFilled(p_min, p_max, fill_col, rounding);
    if (border && (window->Flags & ImGuiWindowFlags_ShowBorders))
    {
        window->DrawList->AddRect(p_min+ImVec2(1,1), p_max+ImVec2(1,1), GetColorU32(ImGuiCol_BorderShadow), rounding);
        window->DrawList->AddRect(p_min, p_max, GetColorU32(ImGuiCol_Border), rounding);
    }
}